

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::makeExnData
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Name tag,
          Literals *payload)

{
  shared_ptr<wasm::ExnData> local_50;
  undefined1 local_40 [8];
  shared_ptr<wasm::ExnData> allocation;
  Literals *payload_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  Name tag_local;
  
  tag_local.super_IString.str._M_len = tag.super_IString.str._M_str;
  this_local = tag.super_IString.str._M_len;
  allocation.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)payload;
  tag_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  std::make_shared<wasm::ExnData,wasm::Name&,wasm::Literals_const&>
            ((Name *)local_40,(Literals *)&this_local);
  std::shared_ptr<wasm::ExnData>::shared_ptr(&local_50,(shared_ptr<wasm::ExnData> *)local_40);
  ::wasm::Literal::Literal(__return_storage_ptr__,&local_50);
  std::shared_ptr<wasm::ExnData>::~shared_ptr(&local_50);
  std::shared_ptr<wasm::ExnData>::~shared_ptr((shared_ptr<wasm::ExnData> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Literal makeExnData(Name tag, const Literals& payload) {
    auto allocation = std::make_shared<ExnData>(tag, payload);
#if __has_feature(leak_sanitizer) || __has_feature(address_sanitizer)
    __lsan_ignore_object(allocation.get());
#endif
    return Literal(allocation);
  }